

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

nng_err nng_aio_alloc(nng_aio **app,_func_void_void_ptr *cb,void *arg)

{
  nng_err nVar1;
  nng_aio *pnStack_28;
  nng_err rv;
  nng_aio *aio;
  void *arg_local;
  _func_void_void_ptr *cb_local;
  nng_aio **app_local;
  
  aio = (nng_aio *)arg;
  arg_local = cb;
  cb_local = (_func_void_void_ptr *)app;
  nVar1 = nni_aio_alloc(&stack0xffffffffffffffd8,cb,arg);
  if (nVar1 == NNG_OK) {
    nng_aio_set_timeout(pnStack_28,-2);
    *(nng_aio **)cb_local = pnStack_28;
  }
  return nVar1;
}

Assistant:

nng_err
nng_aio_alloc(nng_aio **app, void (*cb)(void *), void *arg)
{
	nng_aio *aio;
	nng_err  rv;

	if ((rv = nni_aio_alloc(&aio, (nni_cb) cb, arg)) == 0) {
		nng_aio_set_timeout(aio, NNG_DURATION_DEFAULT);
		*app = aio;
	}
	return (rv);
}